

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall leveldb::anon_unknown_1::PosixEnv::CreateDir(PosixEnv *this,string *name)

{
  int iVar1;
  int *piVar2;
  string *in_RDX;
  Status SStack_18;
  
  (this->super_Env)._vptr_Env = (_func_int **)0x0;
  iVar1 = mkdir((in_RDX->_M_dataplus)._M_p,0x1ed);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    IOError((anon_unknown_1 *)&SStack_18,in_RDX,*piVar2);
    Status::operator=((Status *)this,&SStack_18);
    Status::~Status(&SStack_18);
  }
  return (Status)(char *)this;
}

Assistant:

virtual Status CreateDir(const std::string &name) {
                Status result;
                if (mkdir(name.c_str(), 0755) != 0) {
                    result = IOError(name, errno);
                }
                return result;
            }